

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p,int fUseBuf,int fUseXors,Vec_Int_t *vTargets,int nTargets)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int iVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  size_t sVar9;
  char *__dest;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *vTemp;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar12;
  long lVar13;
  long lVar14;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar8 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (pcVar8 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar8);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,pcVar8);
  }
  p_00->pName = __dest;
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar10 = (p->vObjCopy).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  if (0 < (p->vCis).nSize) {
    lVar13 = 0;
    do {
      uVar1 = (p->vCis).pArray[lVar13];
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_003b52d7;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_003b52d7;
      if ((int)uVar1 < 1) goto LAB_003b531e;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003b5315;
      if (uVar2 <= uVar1) goto LAB_003b52f6;
      piVar10 = (p->vObjCopy).pArray;
      if (piVar10[uVar1] != -1) goto LAB_003b533d;
      piVar10[uVar1] = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < (p->vCis).nSize);
  }
  if (vTargets == (Vec_Int_t *)0x0) {
    if (0 < nTargets) {
      do {
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_003b52d7;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
        if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_003b52d7;
        nTargets = nTargets + -1;
      } while (nTargets != 0);
    }
  }
  else if (0 < vTargets->nSize) {
    lVar13 = 0;
    do {
      uVar1 = vTargets->pArray[lVar13];
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_003b52d7:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_003b52d7;
      if ((int)uVar1 < 1) goto LAB_003b531e;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003b5315;
      if (uVar2 <= uVar1) goto LAB_003b52f6;
      piVar10 = (p->vObjCopy).pArray;
      if (piVar10[uVar1] != -1) goto LAB_003b533d;
      piVar10[uVar1] = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < vTargets->nSize);
  }
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 0x10;
  vTemp->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  vTemp->pArray = piVar10;
  __ptr = Acb_NtkFindNodes2(p);
  iVar3 = __ptr->nSize;
  piVar10 = __ptr->pArray;
  if ((long)iVar3 < 1) {
    if (piVar10 == (int *)0x0) goto LAB_003b51e4;
  }
  else {
    lVar13 = 0;
    do {
      uVar1 = piVar10[lVar13];
      lVar14 = (long)(int)uVar1;
      if (lVar14 < 1) goto LAB_003b531e;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003b5315;
      if (uVar2 <= uVar1) goto LAB_003b52f6;
      if ((p->vObjCopy).pArray[lVar14] == -1) {
        iVar7 = Acb_ObjToGia2(p_00,fUseBuf,p,uVar1,vTemp,fUseXors);
        uVar2 = (p->vObjCopy).nSize;
        if ((int)uVar2 < 1) goto LAB_003b5315;
        if (uVar2 <= uVar1) goto LAB_003b52f6;
        piVar6 = (p->vObjCopy).pArray;
        if (piVar6[lVar14] != -1) {
LAB_003b533d:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar6[lVar14] = iVar7;
      }
      lVar13 = lVar13 + 1;
    } while (iVar3 != lVar13);
  }
  free(piVar10);
LAB_003b51e4:
  free(__ptr);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  if (0 < (p->vCos).nSize) {
    lVar13 = 0;
    do {
      iVar3 = (p->vCos).pArray[lVar13];
      if ((long)iVar3 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar3) {
LAB_003b52f6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vObjFans).pArray[iVar3];
      if (((long)iVar3 < 0) || ((p->vFanSto).nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar1 = (p->vFanSto).pArray[(long)iVar3 + 1];
      if ((long)(int)uVar1 < 1) goto LAB_003b531e;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003b5315;
      if (uVar2 <= uVar1) goto LAB_003b52f6;
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[(int)uVar1]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (p->vCos).nSize);
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManUpdateCopy(&p->vObjCopy,p_00);
  Gia_ManStop(p_00);
  return pGVar12;
LAB_003b531e:
  pcVar8 = "i>0";
  goto LAB_003b5325;
LAB_003b5315:
  pcVar8 = "Acb_NtkHasObjCopies(p)";
LAB_003b5325:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p, int fUseBuf, int fUseXors, Vec_Int_t * vTargets, int nTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    else
        for ( i = 0; i < nTargets; i++ )
            Gia_ManAppendCi(pNew);
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, fUseBuf, p, iObj, vFanins, fUseXors) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}